

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallDirectoryGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallDirectoryGenerator::AddDirectoryInstallRule
          (cmInstallDirectoryGenerator *this,ostream *os,string *config,Indent indent,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dirs)

{
  string local_48;
  
  GetDestination(&local_48,this,config);
  cmInstallGenerator::AddInstallRule
            (&this->super_cmInstallGenerator,os,&local_48,cmInstallType_DIRECTORY,dirs,
             this->Optional,(this->FilePermissions)._M_dataplus._M_p,
             (this->DirPermissions)._M_dataplus._M_p,(char *)0x0,
             (this->LiteralArguments)._M_dataplus._M_p,indent);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmInstallDirectoryGenerator::AddDirectoryInstallRule(
  std::ostream& os, const std::string& config, Indent indent,
  std::vector<std::string> const& dirs)
{
  // Write code to install the directories.
  const char* no_rename = CM_NULLPTR;
  this->AddInstallRule(os, this->GetDestination(config),
                       cmInstallType_DIRECTORY, dirs, this->Optional,
                       this->FilePermissions.c_str(),
                       this->DirPermissions.c_str(), no_rename,
                       this->LiteralArguments.c_str(), indent);
}